

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

json * __thiscall argo::json::operator[](json *this,size_t index)

{
  pointer puVar1;
  json_exception *this_00;
  char *json_type_name;
  json_array_index_range_exception *this_01;
  
  if (this->m_type != array_e) {
    this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
    json_type_name = get_instance_type_name(this);
    json_exception::json_exception(this_00,not_an_array_e,json_type_name);
    __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
  }
  puVar1 = (this->m_value).u_array.
           super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (index < (ulong)((long)(this->m_value).u_array.
                            super__Vector_base<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return (json *)((_Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>)
                   puVar1[index]._M_t.
                   super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t).
                   super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>;
  }
  this_01 = (json_array_index_range_exception *)__cxa_allocate_exception(0xd8);
  json_array_index_range_exception::json_array_index_range_exception
            (this_01,array_index_range_e,index);
  __cxa_throw(this_01,&json_array_index_range_exception::typeinfo,std::exception::~exception);
}

Assistant:

const json &json::operator[](size_t index) const
{
    if (m_type == array_e)
    {
        if (index < m_value.u_array.size())
        {
            return *(m_value.u_array)[index];
        }
        else
        {
            throw json_array_index_range_exception(json_exception::array_index_range_e, index);
        }
    }
    else
    {
        throw json_exception(json_exception::not_an_array_e, get_instance_type_name());
    }
}